

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFileReader.cpp
# Opt level: O3

shared_ptr<const_Assimp::STEP::EXPRESS::DataType> __thiscall
Assimp::STEP::EXPRESS::DataType::Parse
          (DataType *this,char **inout,uint64_t line,ConversionSchema *schema)

{
  _Rb_tree_header *p_Var1;
  byte bVar2;
  char cVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  bool bVar5;
  uint uVar6;
  const_iterator cVar7;
  ulong uVar8;
  Logger *this_00;
  _func_int *p_Var9;
  char *pcVar10;
  _func_int **pp_Var11;
  SyntaxError *pSVar12;
  byte *pbVar13;
  byte *pbVar14;
  _func_int **pp_Var15;
  long lVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  undefined **ppuVar17;
  char cVar18;
  _func_int *p_Var19;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> sVar20;
  shared_ptr<const_Assimp::STEP::EXPRESS::LIST> sVar21;
  string s;
  undefined1 local_79;
  key_type local_78;
  byte *local_50;
  DataType local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  ConversionSchema *local_38;
  
  local_50 = (byte *)*inout;
  while( true ) {
    bVar2 = *local_50;
    uVar8 = (ulong)bVar2;
    if ((bVar2 != 0x20) && (bVar2 != 9)) break;
    local_50 = local_50 + 1;
  }
  uVar6 = (uint)bVar2;
  if ((uVar6 < 0x2d) && ((0x100000003401U >> ((ulong)uVar6 & 0x3f) & 1) != 0)) {
    pSVar12 = (SyntaxError *)__cxa_allocate_exception(0x10);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"unexpected token, expected parameter","");
    SyntaxError::SyntaxError(pSVar12,&local_78,line);
    __cxa_throw(pSVar12,&SyntaxError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (schema != (ConversionSchema *)0x0) {
    bVar5 = false;
    pbVar13 = local_50;
    do {
      if (uVar6 < 0x29) {
        if (uVar6 == 0) break;
        if (uVar6 == 0x28) goto LAB_0067ee3f;
      }
      else if ((uVar6 == 0x29) || (uVar6 == 0x2c)) break;
      bVar5 = (bool)(bVar5 | ((char)uVar6 != '\t' && (char)uVar6 != ' '));
      uVar6 = (uint)pbVar13[1];
      pbVar13 = pbVar13 + 1;
    } while( true );
  }
LAB_0067ef2e:
  pbVar13 = local_50;
  switch((int)uVar8) {
  case 0x22:
    pSVar12 = (SyntaxError *)__cxa_allocate_exception(0x10);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"binary data not supported yet","");
    SyntaxError::SyntaxError(pSVar12,&local_78,line);
    __cxa_throw(pSVar12,&SyntaxError::typeinfo,std::runtime_error::~runtime_error);
  case 0x23:
    local_50 = local_50 + 1;
    local_48._vptr_DataType = (_func_int **)strtoul10_64((char *)local_50,inout,(uint *)0x0);
    local_78._M_dataplus._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Assimp::STEP::EXPRESS::ENTITY,std::allocator<Assimp::STEP::EXPRESS::ENTITY>,unsigned_long>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78._M_string_length,
               (ENTITY **)&local_78,(allocator<Assimp::STEP::EXPRESS::ENTITY> *)&local_79,
               (unsigned_long *)&local_48);
    ppuVar17 = (undefined **)extraout_RDX_01;
    break;
  case 0x24:
    *inout = (char *)(local_50 + 1);
    pp_Var11 = (_func_int **)operator_new(0x18);
    pp_Var11[1] = (_func_int *)0x100000001;
    *pp_Var11 = (_func_int *)&PTR___Sp_counted_ptr_inplace_008da548;
    ppuVar17 = &PTR__DataType_008da598;
    goto LAB_0067f11f;
  default:
    do {
      if ((byte)uVar8 < 0x2f) {
        if ((0x120100000201U >> (uVar8 & 0x3f) & 1) != 0) {
          bVar2 = *pbVar13;
          p_Var9 = (_func_int *)
                   strtoul10_64((char *)(pbVar13 + (bVar2 == 0x2b || bVar2 == 0x2d)),inout,
                                (uint *)0x0);
          p_Var19 = (_func_int *)-(long)p_Var9;
          if (bVar2 != 0x2d) {
            p_Var19 = p_Var9;
          }
          pp_Var11 = (_func_int **)operator_new(0x20);
          pp_Var11[1] = (_func_int *)0x100000001;
          *pp_Var11 = (_func_int *)&PTR___Sp_counted_ptr_inplace_008da738;
          pp_Var15 = pp_Var11 + 2;
          ppuVar17 = &PTR__DataType_008da788;
          pp_Var11[2] = (_func_int *)&PTR__DataType_008da788;
          pp_Var11[3] = p_Var19;
          goto LAB_0067f1f6;
        }
        if (uVar8 == 0x2e) goto LAB_0067f20f;
      }
      uVar8 = (ulong)local_50[1];
      local_50 = local_50 + 1;
    } while( true );
  case 0x27:
    while( true ) {
      local_50 = local_50 + 1;
      if (*local_50 == 0x27) break;
      if (*local_50 == 0) {
        pSVar12 = (SyntaxError *)__cxa_allocate_exception(0x10);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"string literal not closed","");
        SyntaxError::SyntaxError(pSVar12,&local_78,line);
        __cxa_throw(pSVar12,&SyntaxError::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    while (local_50[1] == 0x27) {
      for (local_50 = local_50 + 2; *local_50 != 0x27; local_50 = local_50 + 1) {
        if (*local_50 == 0) {
          pSVar12 = (SyntaxError *)__cxa_allocate_exception(0x10);
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,"string literal not closed","");
          SyntaxError::SyntaxError(pSVar12,&local_78,line);
          __cxa_throw(pSVar12,&SyntaxError::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
    *inout = (char *)(local_50 + 1);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78);
    bVar5 = StringToUTF8(&local_78);
    if (!bVar5) {
      this_00 = DefaultLogger::get();
      Logger::error(this_00,"an error occurred reading escape sequences in ASCII text");
    }
    local_48._vptr_DataType = (_func_int **)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Assimp::STEP::EXPRESS::PrimitiveDataType<std::__cxx11::string>,std::allocator<Assimp::STEP::EXPRESS::PrimitiveDataType<std::__cxx11::string>>,std::__cxx11::string&>
              (&_Stack_40,
               (PrimitiveDataType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                **)&local_48,
               (allocator<Assimp::STEP::EXPRESS::PrimitiveDataType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_79,&local_78);
    this->_vptr_DataType = (_func_int **)local_48;
    this[1]._vptr_DataType = (_func_int **)_Stack_40._M_pi;
    ppuVar17 = (undefined **)extraout_RDX_02;
    goto LAB_0067f177;
  case 0x28:
    *inout = (char *)local_50;
    sVar21 = LIST::Parse((char **)&local_78,(uint64_t)inout,(ConversionSchema *)line);
    ppuVar17 = (undefined **)
               sVar21.
               super___shared_ptr<const_Assimp::STEP::EXPRESS::LIST,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
    break;
  case 0x2a:
    *inout = (char *)(local_50 + 1);
    pp_Var11 = (_func_int **)operator_new(0x18);
    pp_Var11[1] = (_func_int *)0x100000001;
    *pp_Var11 = (_func_int *)&PTR___Sp_counted_ptr_inplace_008da4d8;
    ppuVar17 = &PTR__DataType_008da528;
LAB_0067f11f:
    pp_Var15 = pp_Var11 + 2;
    pp_Var11[2] = (_func_int *)ppuVar17;
LAB_0067f1f6:
    this->_vptr_DataType = pp_Var15;
    this[1]._vptr_DataType = pp_Var11;
    goto LAB_0067f1fd;
  case 0x2e:
    while( true ) {
      local_50 = pbVar13 + 1;
      if (*local_50 == 0x2e) break;
      pbVar13 = local_50;
      if (*local_50 == 0) {
        pSVar12 = (SyntaxError *)__cxa_allocate_exception(0x10);
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"enum not closed","");
        SyntaxError::SyntaxError(pSVar12,&local_78,line);
        __cxa_throw(pSVar12,&SyntaxError::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    *inout = (char *)(pbVar13 + 2);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78);
    local_48._vptr_DataType = (_func_int **)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Assimp::STEP::EXPRESS::ENUMERATION,std::allocator<Assimp::STEP::EXPRESS::ENUMERATION>,std::__cxx11::string>
              (&_Stack_40,(ENUMERATION **)&local_48,
               (allocator<Assimp::STEP::EXPRESS::ENUMERATION> *)&local_79,&local_78);
    _Var4._M_pi = _Stack_40._M_pi;
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this->_vptr_DataType = (_func_int **)local_48;
    this[1]._vptr_DataType = (_func_int **)_Var4._M_pi;
    local_48._vptr_DataType = (_func_int **)0x0;
    ppuVar17 = (undefined **)extraout_RDX_03;
LAB_0067f177:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      ppuVar17 = (undefined **)extraout_RDX_04;
    }
    goto LAB_0067f1fd;
  }
  *(undefined4 *)&this->_vptr_DataType = local_78._M_dataplus._M_p._0_4_;
  *(undefined4 *)((long)&this->_vptr_DataType + 4) = local_78._M_dataplus._M_p._4_4_;
  *(undefined4 *)&this[1]._vptr_DataType = (undefined4)local_78._M_string_length;
  *(undefined4 *)((long)&this[1]._vptr_DataType + 4) = local_78._M_string_length._4_4_;
LAB_0067f1fd:
  sVar20.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar17;
  sVar20.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this;
  return (shared_ptr<const_Assimp::STEP::EXPRESS::DataType>)
         sVar20.
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>;
LAB_0067ee3f:
  if (bVar5) {
    do {
      do {
        pbVar14 = pbVar13;
        pbVar13 = pbVar14 + -1;
      } while (pbVar14[-1] == 9);
    } while (pbVar14[-1] == 0x20);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_38 = (ConversionSchema *)line;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,local_50,pbVar14);
    if (CONCAT44(local_78._M_string_length._4_4_,(undefined4)local_78._M_string_length) != 0) {
      lVar16 = 0;
      do {
        cVar3 = local_78._M_dataplus._M_p[lVar16];
        cVar18 = cVar3 + ' ';
        if (0x19 < (byte)(cVar3 + 0xbfU)) {
          cVar18 = cVar3;
        }
        local_78._M_dataplus._M_p[lVar16] = cVar18;
        lVar16 = lVar16 + 1;
      } while (CONCAT44(local_78._M_string_length._4_4_,(undefined4)local_78._M_string_length) !=
               lVar16);
    }
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
                    *)schema,&local_78);
    p_Var1 = &(schema->converters)._M_t._M_impl.super__Rb_tree_header;
    ppuVar17 = (undefined **)extraout_RDX;
    if ((_Rb_tree_header *)cVar7._M_node != p_Var1) {
      do {
        local_50 = pbVar14 + 1;
        bVar2 = *pbVar14;
        pbVar14 = local_50;
      } while (bVar2 != 0x28);
      sVar20 = Parse(this,(char **)&local_50,0xffffffffffffffff,(ConversionSchema *)0x0);
      ppuVar17 = (undefined **)
                 sVar20.
                 super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
      *inout = (char *)(local_50 + (*local_50 != 0));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      ppuVar17 = (undefined **)extraout_RDX_00;
    }
    if ((_Rb_tree_header *)cVar7._M_node != p_Var1) goto LAB_0067f1fd;
    uVar8 = (ulong)*local_50;
    line = (uint64_t)local_38;
  }
  goto LAB_0067ef2e;
LAB_0067f20f:
  pcVar10 = fast_atoreal_move<double>((char *)pbVar13,(double *)&local_78,true);
  *inout = pcVar10;
  pp_Var11 = (_func_int **)operator_new(0x20);
  pp_Var11[1] = (_func_int *)0x100000001;
  *pp_Var11 = (_func_int *)&PTR___Sp_counted_ptr_inplace_008da6c8;
  pp_Var15 = pp_Var11 + 2;
  ppuVar17 = &PTR__DataType_008da718;
  pp_Var11[2] = (_func_int *)&PTR__DataType_008da718;
  pp_Var11[3] = (_func_int *)local_78._M_dataplus._M_p;
  goto LAB_0067f1f6;
}

Assistant:

std::shared_ptr<const EXPRESS::DataType> EXPRESS::DataType::Parse(const char*& inout,uint64_t line, const EXPRESS::ConversionSchema* schema /*= NULL*/)
{
    const char* cur = inout;
    SkipSpaces(&cur);
    if (*cur == ',' || IsSpaceOrNewLine(*cur)) {
        throw STEP::SyntaxError("unexpected token, expected parameter",line);
    }

    // just skip over constructions such as IFCPLANEANGLEMEASURE(0.01) and read only the value
    if (schema) {
        bool ok = false;
        for(const char* t = cur; *t && *t != ')' && *t != ','; ++t) {
            if (*t=='(') {
                if (!ok) {
                    break;
                }
                for(--t;IsSpace(*t);--t);
                std::string s(cur,static_cast<size_t>(t-cur+1));
                std::transform(s.begin(),s.end(),s.begin(),&ToLower<char> );
                if (schema->IsKnownToken(s)) {
                    for(cur = t+1;*cur++ != '(';);
                    const std::shared_ptr<const EXPRESS::DataType> dt = Parse(cur);
                    inout = *cur ? cur+1 : cur;
                    return dt;
                }
                break;
            }
            else if (!IsSpace(*t)) {
                ok = true;
            }
        }
    }

    if (*cur == '*' ) {
        inout = cur+1;
        return std::make_shared<EXPRESS::ISDERIVED>();
    }
    else if (*cur == '$' ) {
        inout = cur+1;
        return std::make_shared<EXPRESS::UNSET>();
    }
    else if (*cur == '(' ) {
        // start of an aggregate, further parsing is done by the LIST factory constructor
        inout = cur;
        return EXPRESS::LIST::Parse(inout,line,schema);
    }
    else if (*cur == '.' ) {
        // enum (includes boolean)
        const char* start = ++cur;
        for(;*cur != '.';++cur) {
            if (*cur == '\0') {
                throw STEP::SyntaxError("enum not closed",line);
            }
        }
        inout = cur+1;
        return std::make_shared<EXPRESS::ENUMERATION>(std::string(start, static_cast<size_t>(cur-start) ));
    }
    else if (*cur == '#' ) {
        // object reference
        return std::make_shared<EXPRESS::ENTITY>(strtoul10_64(++cur,&inout));
    }
    else if (*cur == '\'' ) {
        // string literal
        const char* start = ++cur;

        for(;*cur != '\'';++cur)    {
            if (*cur == '\0')   {
                throw STEP::SyntaxError("string literal not closed",line);
            }
        }

        if (cur[1] == '\'') {
            // Vesanen: more than 2 escaped ' in one literal!
            do  {
                for(cur += 2;*cur != '\'';++cur)    {
                    if (*cur == '\0')   {
                        throw STEP::SyntaxError("string literal not closed",line);
                    }
                }
            }
            while(cur[1] == '\'');
        }

        inout = cur + 1;

        // assimp is supposed to output UTF8 strings, so we have to deal
        // with foreign encodings.
        std::string stemp = std::string(start, static_cast<size_t>(cur - start));
        if(!StringToUTF8(stemp)) {
            // TODO: route this to a correct logger with line numbers etc., better error messages
            ASSIMP_LOG_ERROR("an error occurred reading escape sequences in ASCII text");
        }

        return std::make_shared<EXPRESS::STRING>(stemp);
    }
    else if (*cur == '\"' ) {
        throw STEP::SyntaxError("binary data not supported yet",line);
    }

    // else -- must be a number. if there is a decimal dot in it,
    // parse it as real value, otherwise as integer.
    const char* start = cur;
    for(;*cur  && *cur != ',' && *cur != ')' && !IsSpace(*cur);++cur) {
        if (*cur == '.') {
            double f;
            inout = fast_atoreal_move<double>(start,f);
            return std::make_shared<EXPRESS::REAL>(f);
        }
    }

    bool neg = false;
    if (*start == '-') {
        neg = true;
        ++start;
    }
    else if (*start == '+') {
        ++start;
    }
    int64_t num = static_cast<int64_t>( strtoul10_64(start,&inout) );
    return std::make_shared<EXPRESS::INTEGER>(neg?-num:num);
}